

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplosionDescriptor.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::ExplosionDescriptor::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ExplosionDescriptor *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Descriptor:",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tType:     ",0xc);
  EntityType::GetAsString_abi_cxx11_(&local_1c0,&(this->super_Descriptor).m_Type);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tMaterial: ",0xb);
  ENUMS::GetEnumAsStringExplosiveMaterial_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)this->m_ui16ExplMat,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tForce:    ",0xc);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32ExplForce);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString ExplosionDescriptor::GetAsString() const
{
    KStringStream ss;

    ss << "Descriptor:"
       << "\n\tType:     " << m_Type.GetAsString()
       << "\tMaterial: "   << GetEnumAsStringExplosiveMaterial( m_ui16ExplMat )
       << "\n\tForce:    " << m_f32ExplForce       
       << "\n";

    return ss.str();
}